

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O1

void __thiscall QPDFArgParser::readArgsFromFile(QPDFArgParser *this,string *filename)

{
  element_type *peVar1;
  int iVar2;
  undefined1 in_CL;
  _List_node_base *p_Var3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  _List_node_base *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48._M_impl._M_node._M_size = 0;
  local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_48;
  iVar2 = std::__cxx11::string::compare((char *)filename);
  if (iVar2 == 0) {
    QUtil::read_lines_from_file_abi_cxx11_
              ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_70,(QUtil *)&std::cin,(istream *)0x0,(bool)in_CL);
  }
  else {
    QUtil::read_lines_from_file_abi_cxx11_
              ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_70,(QUtil *)(filename->_M_dataplus)._M_p,(char *)0x0,(bool)in_CL);
  }
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_48,&local_70);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_70);
  if (local_48._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_48) {
    p_Var3 = local_48._M_impl._M_node.super__List_node_base._M_next;
    do {
      peVar1 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      QUtil::make_shared_cstr((QUtil *)&local_58,(string *)(p_Var3 + 1));
      local_70._M_impl._M_node.super__List_node_base._M_next = local_58;
      local_70._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)p_Stack_50;
      local_58 = (_List_node_base *)0x0;
      p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>>::
      emplace_back<std::shared_ptr<char_const>>
                ((vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>> *)
                 &peVar1->new_argv,(shared_ptr<const_char> *)&local_70);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_70._M_impl._M_node.super__List_node_base._M_prev !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_70._M_impl._M_node.super__List_node_base._M_prev);
      }
      if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
      }
      p_Var3 = (((_List_impl *)&p_Var3->_M_next)->_M_node).super__List_node_base._M_next;
    } while (p_Var3 != (_List_node_base *)&local_48);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_48);
  return;
}

Assistant:

void
QPDFArgParser::readArgsFromFile(std::string const& filename)
{
    std::list<std::string> lines;
    if (filename == "-") {
        QTC::TC("libtests", "QPDFArgParser read args from stdin");
        lines = QUtil::read_lines_from_file(std::cin);
    } else {
        QTC::TC("libtests", "QPDFArgParser read args from file");
        lines = QUtil::read_lines_from_file(filename.c_str());
    }
    for (auto const& line: lines) {
        m->new_argv.push_back(QUtil::make_shared_cstr(line));
    }
}